

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
google::
dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
          (dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  bool bVar1;
  long lVar2;
  int bit;
  long lVar3;
  ulong uVar4;
  uchar bits;
  long local_48;
  size_type new_num_buckets;
  MagicNumberType magic_read;
  
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)this);
  bVar1 = sparsehash_internal::read_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                    (param_2,&magic_read,4);
  if (((bVar1) && (magic_read == 0x13578642)) &&
     (bVar1 = sparsehash_internal::read_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                        (param_2,&new_num_buckets,8), bVar1)) {
    dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::clear_to_size((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)this,new_num_buckets);
    bVar1 = sparsehash_internal::read_bigendian_number<std::__cxx11::stringstream,unsigned_long>
                      (param_2,(unsigned_long *)(this + 0x50),8);
    if (bVar1) {
      lVar2 = 0;
      uVar4 = 0;
      while( true ) {
        if (*(ulong *)(this + 0x58) <= uVar4) {
          return true;
        }
        bVar1 = sparsehash_internal::read_data_internal_for_istream<std::istream>
                          ((basic_istream<char,_std::char_traits<char>_> *)param_2,&bits,1);
        if (!bVar1) break;
        local_48 = lVar2;
        for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
          if (((uVar4 + lVar3 < *(ulong *)(this + 0x58)) &&
              ((bits >> ((uint)lVar3 & 0x1f) & 1) != 0)) &&
             (bVar1 = sparsehash_internal::read_data_internal_for_istream<std::istream>
                                ((basic_istream<char,_std::char_traits<char>_> *)param_2,
                                 (void *)(*(long *)(this + 0x70) + lVar2),8), !bVar1)) {
            return false;
          }
          lVar2 = lVar2 + 8;
        }
        uVar4 = uVar4 + 8;
        lVar2 = local_48 + 0x40;
      }
    }
  }
  return false;
}

Assistant:

bool unserialize(ValueSerializer serializer, INPUT* fp) {
    assert(settings.use_empty() && "empty_key not set for read");

    clear();  // just to be consistent
    MagicNumberType magic_read;
    if (!sparsehash_internal::read_bigendian_number(fp, &magic_read, 4))
      return false;
    if (magic_read != MAGIC_NUMBER) {
      return false;
    }
    size_type new_num_buckets;
    if (!sparsehash_internal::read_bigendian_number(fp, &new_num_buckets, 8))
      return false;
    clear_to_size(new_num_buckets);
    if (!sparsehash_internal::read_bigendian_number(fp, &num_elements, 8))
      return false;

    // Read the bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits;
      if (!sparsehash_internal::read_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && (bits & (1 << bit))) {  // not empty
          if (!serializer(fp, &table[i + bit])) return false;
        }
      }
    }
    return true;
  }